

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# identifyInlinableBlocks.cpp
# Opt level: O3

void identifyInlinableBlocks(Module *module,Program *program)

{
  Function *pFVar1;
  Module *pMVar2;
  pointer ppEVar3;
  bool bVar4;
  Func *this;
  Block *pBVar5;
  long lVar6;
  BasicBlock *pBVar7;
  Module *f;
  Function *pFVar8;
  
  for (pMVar2 = *(Module **)(module + 0x20); pMVar2 != module + 0x18;
      pMVar2 = *(Module **)(pMVar2 + 8)) {
    f = pMVar2 + -0x38;
    if (pMVar2 == (Module *)0x0) {
      f = (Module *)0x0;
    }
    this = Program::getFunction(program,(Function *)f);
    pFVar1 = (Function *)f + 0x48;
    pFVar8 = *(Function **)((Function *)f + 0x50);
    if (pFVar8 != pFVar1) {
      do {
        pBVar7 = (BasicBlock *)(pFVar8 + -0x18);
        if (pFVar8 == (Function *)0x0) {
          pBVar7 = (BasicBlock *)0x0;
        }
        pBVar5 = Func::createBlockIfNotExist(this,pBVar7);
        lVar6 = llvm::BasicBlock::getSinglePredecessor();
        bVar4 = true;
        if (lVar6 == 0) {
          ppEVar3 = (pBVar5->expressions).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((long)(pBVar5->expressions).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3 == 8) {
            bVar4 = RetExpr::classof(*ppEVar3);
          }
          else {
            bVar4 = false;
          }
        }
        pBVar5->doInline = bVar4;
        pFVar8 = *(Function **)(pFVar8 + 8);
      } while (pFVar8 != pFVar1);
      pFVar8 = *(Function **)((Function *)f + 0x50);
    }
    if (pFVar8 != pFVar1) {
      pBVar7 = (BasicBlock *)(pFVar8 + -0x18);
      if (pFVar8 == (Function *)0x0) {
        pBVar7 = (BasicBlock *)0x0;
      }
      pBVar5 = Func::createBlockIfNotExist(this,pBVar7);
      pBVar5->doInline = false;
      pBVar5->isFirst = true;
    }
  }
  Program::addPass(program,IdentifyInlinableBlocks);
  return;
}

Assistant:

void identifyInlinableBlocks(const llvm::Module* module, Program& program) {
    assert(program.isPassCompleted(PassType::CreateExpressions));
    assert(program.isPassCompleted(PassType::ParseBreaks));

    for (const llvm::Function& func : module->functions()) {
        auto* function = program.getFunction(&func);
        for (const auto& block : func) {
            auto* myBlock = function->createBlockIfNotExist(&block);
            myBlock->doInline = isSafeToInline(&block, myBlock);
        }

        if (func.begin() == func.end())
            continue;

        // first block is only inlinable if there are no predecessors
        auto& firstBlock = *func.begin();
        auto* myBlock = function->createBlockIfNotExist(&firstBlock);

        myBlock->doInline = false;
        myBlock->isFirst = true;
    }

    program.addPass(PassType::IdentifyInlinableBlocks);
}